

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist_get.c
# Opt level: O2

void * linkedlist_get(s_linkedlist *linked_list,uint index)

{
  int iVar1;
  
  iVar1 = index + 1;
  do {
    linked_list = (s_linkedlist *)((s_linkedlist_node *)linked_list)->next;
    if ((s_linkedlist_node *)linked_list == (s_linkedlist_node *)0x0) {
      return (void *)0x0;
    }
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return ((s_linkedlist_node *)linked_list)->element;
}

Assistant:

void *linkedlist_get(s_linkedlist *linked_list, unsigned int index) {
    s_linkedlist_node *node = linked_list->head;

    while (node != NULL) {
        if (index == 0) {
            return (node->element);
        }

        index -= 1;
        node = node->next;
    }

    return (NULL);
}